

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double gamln(double *a)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double local_18;
  
  dVar3 = *a;
  if (dVar3 <= 0.8) {
    dVar4 = gamln1(a);
    dVar3 = log(*a);
    dVar4 = dVar4 - dVar3;
  }
  else {
    if (dVar3 <= 2.25) {
      gamln::t = dVar3 + -0.5 + -0.5;
      dVar3 = gamln1(&gamln::t);
      return dVar3;
    }
    if (10.0 <= dVar3) {
      gamln::t = (1.0 / dVar3) * (1.0 / dVar3);
      dVar3 = *a;
      local_18 = (((((gamln::t * -0.00165322962780713 + 0.000837308034031215) * gamln::t +
                    -0.00059520293135187) * gamln::t + 0.00079365066682539) * gamln::t +
                  -0.00277777777760991) * gamln::t + 0.0833333333333333) / dVar3 + 0.418938533204673
      ;
      dVar4 = log(dVar3);
      dVar4 = (dVar4 + -1.0) * (dVar3 + -0.5);
    }
    else {
      iVar1 = 0;
      if (0 < (int)(dVar3 + -1.25)) {
        iVar1 = (int)(dVar3 + -1.25);
      }
      dVar4 = 1.0;
      gamln::t = dVar3;
      while( true ) {
        gamln::T1 = gamln::t + -1.0;
        bVar2 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar2) break;
        dVar4 = dVar4 * gamln::T1;
        gamln::t = gamln::T1;
      }
      local_18 = gamln1(&gamln::T1);
      dVar4 = log(dVar4);
    }
    dVar4 = dVar4 + local_18;
  }
  return dVar4;
}

Assistant:

double gamln(double *a)
/*
-----------------------------------------------------------------------
            EVALUATION OF LN(GAMMA(A)) FOR POSITIVE A
-----------------------------------------------------------------------
     WRITTEN BY ALFRED H. MORRIS
          NAVAL SURFACE WARFARE CENTER
          DAHLGREN, VIRGINIA
--------------------------
     D = 0.5*(LN(2*PI) - 1)
--------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double d = .418938533204673e0;
static double gamln,t,w;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    if(*a > 0.8e0) goto S10;
    gamln = gamln1(a)-log(*a);
    return gamln;
S10:
    if(*a > 2.25e0) goto S20;
    t = *a-0.5e0-0.5e0;
    gamln = gamln1(&t);
    return gamln;
S20:
    if(*a >= 10.0e0) goto S40;
    n = *a-1.25e0;
    t = *a;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        t -= 1.0e0;
        w = t*w;
    }
    T1 = t-1.0e0;
    gamln = gamln1(&T1)+log(w);
    return gamln;
S40:
    t = pow(1.0e0/ *a,2.0);
    w = (((((c5*t+c4)*t+c3)*t+c2)*t+c1)*t+c0)/ *a;
    gamln = d+w+(*a-0.5e0)*(log(*a)-1.0e0);
    return gamln;
}